

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  allocator<char> local_1d9;
  string local_1d8;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_188;
  undefined1 local_168 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  GraphicsPipeline::Resources::Resources
            ((Resources *)this_00,this,(Parameters *)((long)&context_local + 7));
  GraphicsPipeline::create
            (&local_1a8,this,(Resources *)this_00,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data.object.m_internal = local_188.object.m_internal;
  data.deleter.m_device = local_188.deleter.m_device;
  data.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_168,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Ok",&local_1d9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  GraphicsPipeline::Resources::~Resources
            ((Resources *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}